

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopStyleVar(int count)

{
  ImGuiContext *pIVar1;
  value_type *pvVar2;
  ImGuiStyleVarInfo *this;
  int *piVar3;
  void *data;
  ImGuiStyleVarInfo *info;
  ImGuiStyleMod *backup;
  ImGuiContext *g;
  int count_local;
  
  pIVar1 = GImGui;
  for (g._4_4_ = count; 0 < g._4_4_; g._4_4_ = g._4_4_ + -1) {
    pvVar2 = ImVector<ImGuiStyleMod>::back(&pIVar1->StyleModifiers);
    this = GetStyleVarInfo(pvVar2->VarIdx);
    piVar3 = (int *)ImGuiStyleVarInfo::GetVarPtr(this,&pIVar1->Style);
    if ((this->Type == 4) && (this->Count == 1)) {
      *piVar3 = (pvVar2->field_1).BackupInt[0];
    }
    else if ((this->Type == 4) && (this->Count == 2)) {
      *piVar3 = (pvVar2->field_1).BackupInt[0];
      piVar3[1] = (pvVar2->field_1).BackupInt[1];
    }
    ImVector<ImGuiStyleMod>::pop_back(&pIVar1->StyleModifiers);
  }
  return;
}

Assistant:

void ImGui::PopStyleVar(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        // We avoid a generic memcpy(data, &backup.Backup.., GDataTypeSize[info->Type] * info->Count), the overhead in Debug is not worth it.
        ImGuiStyleMod& backup = g.StyleModifiers.back();
        const ImGuiStyleVarInfo* info = GetStyleVarInfo(backup.VarIdx);
        void* data = info->GetVarPtr(&g.Style);
        if (info->Type == ImGuiDataType_Float && info->Count == 1)      { ((float*)data)[0] = backup.BackupFloat[0]; }
        else if (info->Type == ImGuiDataType_Float && info->Count == 2) { ((float*)data)[0] = backup.BackupFloat[0]; ((float*)data)[1] = backup.BackupFloat[1]; }
        g.StyleModifiers.pop_back();
        count--;
    }
}